

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_tests.hpp
# Opt level: O0

string * __thiscall
iuutil::TestNameRemoveIndexName_abi_cxx11_(string *__return_storage_ptr__,iuutil *this,char *name)

{
  char *__beg;
  char *__end;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  char *local_20;
  char *p;
  char *name_local;
  
  p = (char *)this;
  name_local = (char *)__return_storage_ptr__;
  __end = strrchr((char *)this,0x2f);
  __beg = p;
  local_20 = __end;
  if (__end == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__beg,&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,__beg,__end,local_35);
    std::allocator<char>::~allocator(local_35);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string TestNameRemoveIndexName(const char* name)
{
    const char* const p = strrchr(name, '/');
    if( p == NULL )
    {
        return name;
    }
    return ::std::string(name, p);
}